

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O1

void __thiscall
i2p::sam::Session::Session
          (Session *this,path *private_key_file,Proxy *control_host,CThreadInterrupt *interrupt)

{
  long lVar1;
  pointer pcVar2;
  uint32_t uVar3;
  bool bVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::filesystem::__cxx11::path::path((path *)this,&private_key_file->super_path);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&this->m_control_host,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)control_host);
  uVar3 = (control_host->proxy).super_CNetAddr.m_scope_id;
  (this->m_control_host).proxy.super_CNetAddr.m_net = (control_host->proxy).super_CNetAddr.m_net;
  (this->m_control_host).proxy.super_CNetAddr.m_scope_id = uVar3;
  (this->m_control_host).proxy.port = (control_host->proxy).port;
  (this->m_control_host).m_unix_socket_path._M_dataplus._M_p =
       (pointer)&(this->m_control_host).m_unix_socket_path.field_2;
  pcVar2 = (control_host->m_unix_socket_path)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_control_host).m_unix_socket_path,pcVar2,
             pcVar2 + (control_host->m_unix_socket_path)._M_string_length);
  bVar4 = control_host->m_randomize_credentials;
  (this->m_control_host).m_is_unix_socket = control_host->m_is_unix_socket;
  (this->m_control_host).m_randomize_credentials = bVar4;
  this->m_interrupt = interrupt;
  (this->m_mutex).super_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_mutex).super_mutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_mutex).super_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_private_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_private_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_private_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_control_sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
  super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.super__Head_base<0UL,_Sock_*,_false>.
  _M_head_impl = (Sock *)0x0;
  CService::CService(&this->m_my_addr);
  (this->m_session_id)._M_dataplus._M_p = (pointer)&(this->m_session_id).field_2;
  (this->m_session_id)._M_string_length = 0;
  (this->m_session_id).field_2._M_local_buf[0] = '\0';
  this->m_transient = false;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Session::Session(const fs::path& private_key_file,
                 const Proxy& control_host,
                 CThreadInterrupt* interrupt)
    : m_private_key_file{private_key_file},
      m_control_host{control_host},
      m_interrupt{interrupt},
      m_transient{false}
{
}